

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,UniformGridMediumProvider *p,Bounds3<float> *args,
          optional<pbrt::SampledGrid<float>_> *args_1,
          optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> *args_2,RGBColorSpace **args_3,
          SpectrumHandle *args_4,SampledGrid<float> *args_5,polymorphic_allocator<std::byte> *args_6
          )

{
  RGBColorSpace *colorSpace;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_c8;
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> local_c0;
  optional<pbrt::SampledGrid<float>_> local_88;
  SampledGrid<float> local_50;
  
  optional<pbrt::SampledGrid<float>_>::optional(&local_88,args_1);
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::optional(&local_c0,args_2);
  colorSpace = *args_3;
  local_c8.bits =
       (args_4->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_50.values.alloc.memoryResource = (args_5->values).alloc.memoryResource;
  local_50.values.nAlloc = (args_5->values).nAlloc;
  local_50.values.nStored = (args_5->values).nStored;
  local_50.values.ptr = (args_5->values).ptr;
  (args_5->values).ptr = (float *)SUB168(ZEXT816(0) << 0x20,0);
  (args_5->values).nAlloc = SUB168(ZEXT816(0) << 0x20,8);
  (args_5->values).nStored = 0;
  local_50.nz = args_5->nz;
  local_50.nx = args_5->nx;
  local_50.ny = args_5->ny;
  pbrt::UniformGridMediumProvider::UniformGridMediumProvider
            (p,args,&local_88,&local_c0,colorSpace,(SpectrumHandle *)&local_c8,&local_50,
             args_6->memoryResource);
  vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_50.values);
  if (local_c0.set == true) {
    vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
    ::~vector((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
               *)&local_c0);
    local_c0.set = false;
  }
  if (local_88.set == true) {
    vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)&local_88);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }